

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void uavs3d_if_ver_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  int local_48;
  pel local_44;
  int local_40;
  int val;
  int sum;
  int col;
  int row;
  int height_local;
  int width_local;
  int i_dst_local;
  pel *dst_local;
  pel *ppStack_10;
  int i_src_local;
  pel *src_local;
  
  _width_local = dst;
  ppStack_10 = src;
  for (sum = 0; sum < height; sum = sum + 1) {
    for (val = 0; val < width; val = val + 1) {
      local_48 = (int)((uint)ppStack_10[val + i_src * -3] * (int)*coeff +
                       (uint)ppStack_10[val + i_src * -2] * (int)coeff[1] +
                       (uint)ppStack_10[val - i_src] * (int)coeff[2] +
                       (uint)ppStack_10[val] * (int)coeff[3] +
                       (uint)ppStack_10[val + i_src] * (int)coeff[4] +
                       (uint)ppStack_10[val + i_src * 2] * (int)coeff[5] +
                       (uint)ppStack_10[val + i_src * 3] * (int)coeff[6] +
                       (uint)ppStack_10[val + i_src * 4] * (int)coeff[7] + 0x20) >> 6;
      local_40 = local_48;
      if (max_val < local_48) {
        local_40 = max_val;
      }
      if (local_40 < 0) {
        local_44 = '\0';
      }
      else {
        if (max_val < local_48) {
          local_48 = max_val;
        }
        local_44 = (pel)local_48;
      }
      _width_local[val] = local_44;
    }
    ppStack_10 = ppStack_10 + i_src;
    _width_local = _width_local + i_dst;
  }
  return;
}

Assistant:

static void uavs3d_if_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(src, col, i_src, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}